

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridSpecsBase.hpp
# Opt level: O2

string * __thiscall
sciplot::GridSpecsBase::repr_abi_cxx11_(string *__return_storage_ptr__,GridSpecsBase *this)

{
  size_type sVar1;
  bool bVar2;
  ostream *poVar3;
  string *this_00;
  string show;
  stringstream ss;
  string sStack_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  this_00 = &sStack_228;
  ShowSpecsOf<sciplot::GridSpecsBase>::repr_abi_cxx11_
            (&local_1c8,&this->super_ShowSpecsOf<sciplot::GridSpecsBase>);
  bVar2 = std::operator!=(&local_1c8,"no");
  sVar1 = (this->m_tics)._M_string_length;
  if (sVar1 == 0 && !bVar2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"unset grid",(allocator<char> *)local_1a8);
  }
  else if (bVar2 || sVar1 == 0) {
    std::__cxx11::stringstream::stringstream(local_1a8);
    poVar3 = std::operator<<(local_198,"set grid ");
    poVar3 = std::operator<<(poVar3,(string *)&this->m_tics);
    std::operator<<(poVar3," ");
    std::__cxx11::string::string
              ((string *)&sStack_228,
               (string *)&(this->super_DepthSpecsOf<sciplot::GridSpecsBase>).m_depth);
    poVar3 = std::operator<<(local_198,(string *)&sStack_228);
    std::operator<<(poVar3," ");
    std::__cxx11::string::~string((string *)&sStack_228);
    if (this->m_majortics == true) {
      LineSpecsOf<sciplot::GridSpecsBase>::repr_abi_cxx11_
                (&sStack_228,&this->super_LineSpecsOf<sciplot::GridSpecsBase>);
      std::operator<<(local_198,(string *)&sStack_228);
    }
    else {
      LineSpecsOf<sciplot::GridSpecsBase>::repr_abi_cxx11_
                (&local_1e8,&this->super_LineSpecsOf<sciplot::GridSpecsBase>);
      std::operator+(&sStack_228,", ",&local_1e8);
      std::operator<<(local_198,(string *)&sStack_228);
      std::__cxx11::string::~string((string *)&sStack_228);
      this_00 = &local_1e8;
    }
    std::__cxx11::string::~string((string *)this_00);
    std::__cxx11::stringbuf::str();
    internal::removeExtraWhitespaces(__return_storage_ptr__,&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::stringstream::~stringstream(local_1a8);
  }
  else {
    std::operator+(__return_storage_ptr__,"set grid no",&this->m_tics);
  }
  std::__cxx11::string::~string((string *)&local_1c8);
  return __return_storage_ptr__;
}

Assistant:

inline auto GridSpecsBase::repr() const -> std::string
{
    const auto show = ShowSpecsOf<GridSpecsBase>::repr();
    const auto visible = show != "no";

    if(m_tics.empty() && !visible)
        return "unset grid";

    if(m_tics.size() && !visible)
        return "set grid no" + m_tics;

    std::stringstream ss;
    ss << "set grid " << m_tics << " ";
    ss << DepthSpecsOf<GridSpecsBase>::repr() << " ";
    if(m_majortics)
        ss << LineSpecsOf<GridSpecsBase>::repr();
    else
        ss << ", " + LineSpecsOf<GridSpecsBase>::repr(); // For minor tics, the preceding comma is needed
    return internal::removeExtraWhitespaces(ss.str());
}